

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorbase.h
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::operator*(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *vec)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  byte bVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  x;
  
  bVar7 = 0;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::StableSum(&x);
  uVar3 = (ulong)((long)(this->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 7;
  uVar2 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 * 0x80 != uVar2; uVar2 = uVar2 + 0x80) {
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x1c;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems[0x18] = 0;
    result.m_backend.data._M_elems[0x19] = 0;
    result.m_backend.data._M_elems._104_5_ = 0;
    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result.m_backend,
               (cpp_dec_float<200U,_int,_void> *)
               ((long)&(((this->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + uVar2),
               (cpp_dec_float<200U,_int,_void> *)
               ((long)&(((vec->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + uVar2));
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              ((cpp_dec_float<200U,_int,_void> *)&x,&result.m_backend);
  }
  pSVar5 = &x;
  pnVar6 = __return_storage_ptr__;
  for (lVar1 = 0x1c; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pSVar5->sum).m_backend.data._M_elems[0];
    pSVar5 = (StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)((long)pSVar5 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  (__return_storage_ptr__->m_backend).exp = x.sum.m_backend.exp;
  (__return_storage_ptr__->m_backend).neg = x.sum.m_backend.neg;
  (__return_storage_ptr__->m_backend).fpclass = x.sum.m_backend.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = x.sum.m_backend.prec_elem;
  return __return_storage_ptr__;
}

Assistant:

R operator*(const VectorBase<R>& vec) const
   {
      StableSum<R> x;

      auto dimen = dim();

      for(decltype(dimen) i = 0; i < dimen; i++)
         x += val[i] * vec.val[i];

      return x;
   }